

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_501fe::string::validate
          (string *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e)

{
  ulong uVar1;
  root_schema *prVar2;
  value_t vVar3;
  bool bVar4;
  long *plVar5;
  pointer psVar6;
  long *plVar7;
  pointer *ppsVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  ulong uVar10;
  ostringstream s;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  long local_220;
  pointer local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  pointer local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->minLength_).first == true) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_1a8,instance);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      uVar10 = 0;
    }
    else {
      psVar6 = (pointer)0x0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        psVar6 = (pointer)((long)&(psVar6->
                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).first._M_current + 1);
      } while ((pointer)local_1a8._8_8_ != psVar6);
    }
    uVar1 = (this->minLength_).second;
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if (uVar10 < uVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance is too short as per minLength:",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      (*e->_vptr_error_handler[2])(e,ptr,instance);
      if ((pointer *)local_228._M_current != &local_218) {
        operator_delete(local_228._M_current,
                        (ulong)((long)&(local_218->
                                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).first._M_current + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  if ((this->maxLength_).first == true) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_1a8,instance);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      uVar10 = 0;
    }
    else {
      psVar6 = (pointer)0x0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        psVar6 = (pointer)((long)&(psVar6->
                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).first._M_current + 1);
      } while ((pointer)local_1a8._8_8_ != psVar6);
    }
    uVar1 = (this->maxLength_).second;
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if (uVar1 < uVar10) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance is too long as per maxLength: ",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      (*e->_vptr_error_handler[2])(e,ptr,instance,&local_228);
      if ((pointer *)local_228._M_current != &local_218) {
        operator_delete(local_228._M_current,
                        (ulong)((long)&(local_218->
                                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).first._M_current + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  if ((this->content_).
      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Head_base<0UL,_bool,_false>._M_head_impl == true) {
    prVar2 = (this->super_schema).root_;
    if ((prVar2->content_check_).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_1c8[0] = (pointer)local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,
                 "a content checker was not provided but a contentEncoding or contentMediaType for this string have been present: \'"
                 ,"");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_1c8,
                                  (ulong)(this->content_).
                                         super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                         ._M_head_impl._M_dataplus._M_p);
      local_208 = &local_1f8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_1f8 = *plVar7;
        lStack_1f0 = plVar5[3];
      }
      else {
        local_1f8 = *plVar7;
        local_208 = (long *)*plVar5;
      }
      local_200 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
      local_1e8 = &local_1d8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_1d8 = *plVar7;
        lStack_1d0 = plVar5[3];
      }
      else {
        local_1d8 = *plVar7;
        local_1e8 = (long *)*plVar5;
      }
      local_1e0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1e8,
                                  (ulong)(this->content_).
                                         super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                         ._M_head_impl._M_dataplus._M_p);
      ppsVar8 = (pointer *)(plVar5 + 2);
      if ((pointer *)*plVar5 == ppsVar8) {
        local_218 = *ppsVar8;
        lStack_210 = plVar5[3];
        local_228._M_current = (char *)&local_218;
      }
      else {
        local_218 = *ppsVar8;
        local_228._M_current = (char *)*plVar5;
      }
      local_220 = plVar5[1];
      *plVar5 = (long)ppsVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      psVar6 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == psVar6) {
        local_1a8._16_8_ =
             (psVar6->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).first._M_current;
        local_1a8._24_8_ = plVar5[3];
        local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
      }
      else {
        local_1a8._16_8_ =
             (psVar6->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).first._M_current;
        local_1a8._0_8_ = (pointer)*plVar5;
      }
      local_1a8._8_8_ = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (*e->_vptr_error_handler[2])(e,ptr,instance);
      if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      if ((pointer *)local_228._M_current != &local_218) {
        operator_delete(local_228._M_current,
                        (ulong)((long)&(local_218->
                                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).first._M_current + 1));
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      psVar6 = local_1c8[0];
      if (local_1c8[0] != (pointer)local_1b8) {
LAB_0011fa0e:
        operator_delete(psVar6,(ulong)((long)&(((pointer)local_1b8._0_8_)->
                                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ).first._M_current + 1));
      }
    }
    else {
      (*(prVar2->content_check_)._M_invoker)
                ((_Any_data *)&prVar2->content_check_,
                 &(this->content_).
                  super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  ._M_head_impl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->content_,instance);
    }
  }
  else {
    vVar3 = instance->m_type;
    if (vVar3 != binary) goto LAB_0011fa18;
    local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"expected string, but get binary data","");
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_1a8);
    local_1b8._0_8_ = local_1a8._16_8_;
    psVar6 = (pointer)local_1a8._0_8_;
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) goto LAB_0011fa0e;
  }
  vVar3 = instance->m_type;
LAB_0011fa18:
  if (vVar3 == string) {
    if ((this->pattern_).first == true) {
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_228,instance);
      local_1a8._16_8_ = (pointer)0x0;
      local_1a8._24_8_ = (char *)0x0;
      local_1a8._0_8_ = (pointer)0x0;
      local_1a8._8_8_ = (pointer)0x0;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_228,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_228._M_current + local_220),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_1a8,&(this->pattern_).second,0);
      if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
      }
      if ((pointer *)local_228._M_current != &local_218) {
        operator_delete(local_228._M_current,
                        (ulong)((long)&(local_218->
                                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).first._M_current + 1));
      }
      if (!bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"instance does not match regex pattern: ",&this->patternString_);
        (*e->_vptr_error_handler[2])
                  (e,ptr,instance,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
      }
    }
    if ((this->format_).first == true) {
      prVar2 = (this->super_schema).root_;
      if ((prVar2->format_check_).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_228._M_current = (char *)&local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,
                   "a format checker was not provided but a format keyword for this string is present: "
                   ,"");
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_228,
                                    (ulong)(this->format_).second._M_dataplus._M_p);
        psVar6 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == psVar6) {
          local_1a8._16_8_ =
               (psVar6->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          local_1a8._24_8_ = plVar5[3];
          local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
        }
        else {
          local_1a8._16_8_ =
               (psVar6->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          local_1a8._0_8_ = (pointer)*plVar5;
        }
        local_1a8._8_8_ = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        (*e->_vptr_error_handler[2])(e,ptr,instance);
        if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        psVar6 = local_218;
        _Var9._M_current = local_228._M_current;
        if ((pointer *)local_228._M_current == &local_218) {
          return;
        }
      }
      else {
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_1a8,instance);
        if ((prVar2->format_check_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(prVar2->format_check_)._M_invoker)
                  ((_Any_data *)&prVar2->format_check_,&(this->format_).second,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        psVar6 = (pointer)local_1a8._16_8_;
        _Var9._M_current = (char *)local_1a8._0_8_;
        if ((pointer)local_1a8._0_8_ == (pointer)(local_1a8 + 0x10)) {
          return;
        }
      }
      operator_delete(_Var9._M_current,
                      (ulong)((long)&(psVar6->
                                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).first._M_current + 1));
    }
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		if (minLength_.first) {
			if (utf8_length(instance.get<std::string>()) < minLength_.second) {
				std::ostringstream s;
				s << "instance is too short as per minLength:" << minLength_.second;
				e.error(ptr, instance, s.str());
			}
		}

		if (maxLength_.first) {
			if (utf8_length(instance.get<std::string>()) > maxLength_.second) {
				std::ostringstream s;
				s << "instance is too long as per maxLength: " << maxLength_.second;
				e.error(ptr, instance, s.str());
			}
		}

		if (std::get<0>(content_)) {
			if (root_->content_check() == nullptr)
				e.error(ptr, instance, std::string("a content checker was not provided but a contentEncoding or contentMediaType for this string have been present: '") + std::get<1>(content_) + "' '" + std::get<2>(content_) + "'");
			else {
				try {
					root_->content_check()(std::get<1>(content_), std::get<2>(content_), instance);
				} catch (const std::exception &ex) {
					e.error(ptr, instance, std::string("content-checking failed: ") + ex.what());
				}
			}
		} else if (instance.type() == json::value_t::binary) {
			e.error(ptr, instance, "expected string, but get binary data");
		}

		if (instance.type() != json::value_t::string) {
			return; // next checks only for strings
		}

#ifndef NO_STD_REGEX
		if (pattern_.first &&
		    !REGEX_NAMESPACE::regex_search(instance.get<std::string>(), pattern_.second))
			e.error(ptr, instance, "instance does not match regex pattern: " + patternString_);
#endif

		if (format_.first) {
			if (root_->format_check() == nullptr)
				e.error(ptr, instance, std::string("a format checker was not provided but a format keyword for this string is present: ") + format_.second);
			else {
				try {
					root_->format_check()(format_.second, instance.get<std::string>());
				} catch (const std::exception &ex) {
					e.error(ptr, instance, std::string("format-checking failed: ") + ex.what());
				}
			}
		}
	}